

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O0

uint Extra_CountMintermsSimple(DdNode *bFunc,uint max)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint local_2c;
  uint min;
  uint HKey;
  uint max_local;
  DdNode *bFunc_local;
  
  if (((ulong)bFunc & 1) == 0) {
    if (bFunc->index == 0x7fffffff) {
      local_2c = max;
      if (bFunc == s_Terminal) {
        local_2c = 0;
      }
      bFunc_local._4_4_ = local_2c;
    }
    else {
      uVar3 = ((long)bFunc + (ulong)max * 0xc00005) % 0x3b09;
      if ((HHTable2[uVar3].Arg1 == bFunc) && (HHTable2[uVar3].Arg2 == max)) {
        bFunc_local._4_4_ = HHTable2[uVar3].Res;
      }
      else {
        uVar1 = Extra_CountMintermsSimple((bFunc->type).kids.E,max);
        uVar2 = Extra_CountMintermsSimple((bFunc->type).kids.T,max);
        bFunc_local._4_4_ = (uVar1 >> 1) + (uVar2 >> 1);
        HHTable2[uVar3].Arg1 = bFunc;
        HHTable2[uVar3].Arg2 = max;
        HHTable2[uVar3].Res = bFunc_local._4_4_;
      }
    }
  }
  else {
    uVar1 = Extra_CountMintermsSimple((DdNode *)((ulong)bFunc ^ 1),max);
    bFunc_local._4_4_ = max - uVar1;
  }
  return bFunc_local._4_4_;
}

Assistant:

unsigned Extra_CountMintermsSimple( DdNode * bFunc, unsigned max )
{
    unsigned HKey;

    // normalize
    if ( Cudd_IsComplement(bFunc) )
        return max - Extra_CountMintermsSimple( Cudd_Not(bFunc), max );

    // now it is known that the function is not complemented
    if ( cuddIsConstant(bFunc) )
        return ((bFunc==s_Terminal)? 0: max);

    // check cache
    HKey = hashKey2( bFunc, max, _TABLESIZE_MINT );
    if ( HHTable2[HKey].Arg1 == bFunc && HHTable2[HKey].Arg2 == max )
        return HHTable2[HKey].Res;
    else
    {
        // min = min0/2 + min1/2;
        unsigned min = (Extra_CountMintermsSimple( cuddE(bFunc), max ) >> 1) +
                       (Extra_CountMintermsSimple( cuddT(bFunc), max ) >> 1);

        HHTable2[HKey].Arg1 = bFunc;
        HHTable2[HKey].Arg2 = max;
        HHTable2[HKey].Res  = min;

        return min;
    }
}